

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<double,_2UL>_>::max_side
          (box_base<pico_tree::internal::box<double,_2UL>_> *this,size_type *p_max_index,
          scalar_type *p_max_value)

{
  size_type i;
  size_type sVar1;
  double dVar2;
  double dVar3;
  
  *p_max_value = -1.79769313486232e+308;
  dVar2 = -1.79769313486232e+308;
  for (sVar1 = 0; sVar1 != 2; sVar1 = sVar1 + 1) {
    dVar3 = *(double *)(this + sVar1 * 8 + 0x10) - *(double *)(this + sVar1 * 8);
    if (dVar2 < dVar3) {
      *p_max_index = sVar1;
      *p_max_value = dVar3;
      dVar2 = dVar3;
    }
  }
  return;
}

Assistant:

constexpr void max_side(
      size_type& p_max_index, scalar_type& p_max_value) const {
    p_max_value = std::numeric_limits<scalar_type>::lowest();

    for (size_type i = 0; i < derived().size(); ++i) {
      scalar_type const delta = max(i) - min(i);
      if (delta > p_max_value) {
        p_max_index = i;
        p_max_value = delta;
      }
    }
  }